

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  undefined1 *puVar1;
  string *psVar2;
  mutex *pmVar3;
  bool *in_stack_ffffffffffffffb8;
  shared_ptr<bool> *in_stack_ffffffffffffffc0;
  
  stream::stream(&this->super_stream);
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_00130a20;
  puVar1 = (undefined1 *)operator_new(1);
  *puVar1 = 0;
  std::shared_ptr<bool>::shared_ptr<bool,void>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar2);
  this->_in = psVar2;
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar2);
  this->_out = psVar2;
  pmVar3 = (mutex *)operator_new(0x28);
  std::mutex::mutex((mutex *)0x11aeeb);
  this->_inMut = pmVar3;
  pmVar3 = (mutex *)operator_new(0x28);
  std::mutex::mutex((mutex *)0x11af12);
  this->_outMut = pmVar3;
  this->_master = true;
  this->_block = false;
  return (int)this;
}

Assistant:

blc::tools::pipe::pipe() : _closed(new bool(false)) {
	this->_in = new std::string;
	this->_out = new std::string;
	this->_inMut = new std::mutex;
	this->_outMut = new std::mutex;
	this->_master = true;
	this->_block = false;
}